

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O0

void mutex_cv_ping_pong(ping_pong *pp,int parity)

{
  undefined1 auVar1 [16];
  ulong in_stack_ffffffffffffffd0;
  int parity_local;
  ping_pong *pp_local;
  
  nsync_pthread_mutex_lock_(&pp->mutex);
  while (pp->i < pp->limit) {
    while ((pp->i & 1U) == parity) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_stack_ffffffffffffffd0;
      nsync::nsync_cv_wait_with_deadline_generic
                ((nsync *)(pp->cv + parity),(nsync_cv *)&pp->mutex,void_pthread_mutex_lock,
                 void_pthread_mutex_unlock,(_func_void_void_ptr *)0x7fffffffffffffff,
                 (nsync_time)(auVar1 << 0x40),(nsync_note)0x3b9ac9ff);
    }
    pp->i = pp->i + 1;
    nsync::nsync_cv_signal(pp->cv + (1 - parity));
  }
  nsync_pthread_mutex_unlock_(&pp->mutex);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mutex_cv_ping_pong (ping_pong *pp, int parity) {
	pthread_mutex_lock (&pp->mutex);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_cv_wait_with_deadline_generic (&pp->cv[parity], &pp->mutex,
						             &void_pthread_mutex_lock,
						             &void_pthread_mutex_unlock,
						             nsync_time_no_deadline, NULL);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1-parity]);
	}

	pthread_mutex_unlock (&pp->mutex);
	ping_pong_done (pp);
}